

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

void __thiscall cmServerBase::OnDisconnect(cmServerBase *this,cmConnection *pConnection)

{
  pointer puVar1;
  cmConnection *pcVar2;
  cmConnection *pcVar3;
  pointer __p;
  pointer puVar4;
  pointer __n;
  ulong uVar5;
  void *__buf;
  iterator __first;
  int __fd;
  long lVar6;
  int __flags;
  ulong uVar7;
  pointer puVar8;
  
  uv_rwlock_wrlock(&this->ConnectionsMutex);
  puVar4 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar1 - (long)puVar4;
  __n = puVar4;
  uVar7 = uVar5;
  if (0 < (long)uVar5 >> 5) {
    __n = (pointer)((long)&(puVar4->_M_t).
                           super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>
                           .super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl +
                   (uVar5 & 0xffffffffffffffe0));
    lVar6 = ((long)uVar5 >> 5) + 1;
    __first._M_current = puVar4 + 2;
    do {
      if (__first._M_current[-2]._M_t.
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
        __first._M_current = __first._M_current + -2;
        goto LAB_00458ec8;
      }
      if (__first._M_current[-1]._M_t.
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
        __first._M_current = __first._M_current + -1;
        goto LAB_00458ec8;
      }
      if (((__first._M_current)->_M_t).
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection)
      goto LAB_00458ec8;
      if (__first._M_current[1]._M_t.
          super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
          super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
          super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl == pConnection) {
        __first._M_current = __first._M_current + 1;
        goto LAB_00458ec8;
      }
      lVar6 = lVar6 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar6);
    uVar7 = (long)puVar1 - (long)__n;
  }
  uVar7 = (long)uVar7 >> 3;
  if (uVar7 == 1) {
LAB_00458ea8:
    __first._M_current = __n;
    if ((__n->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl != pConnection) {
      __n = puVar1;
      __first._M_current = puVar1;
    }
  }
  else if (uVar7 == 2) {
LAB_00458e6c:
    __first._M_current = __n;
    if ((__n->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl != pConnection) {
      __n = __n + 1;
      goto LAB_00458ea8;
    }
  }
  else {
    __first._M_current = puVar1;
    if (uVar7 != 3) goto LAB_00458f22;
    __first._M_current = __n;
    if ((__n->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl != pConnection) {
      __n = __n + 1;
      goto LAB_00458e6c;
    }
  }
LAB_00458ec8:
  __n = (pointer)CONCAT71((int7)((ulong)__n >> 8),__first._M_current == puVar1);
  puVar8 = __first._M_current + 1;
  if (puVar8 != puVar1 && __first._M_current != puVar1) {
    do {
      pcVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
               super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
               super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl;
      if (pcVar2 != pConnection) {
        (puVar8->_M_t).super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl = (cmConnection *)0x0;
        pcVar3 = ((__first._M_current)->_M_t).
                 super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
                 super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
                 super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl;
        ((__first._M_current)->_M_t).
        super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
        super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
        super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl = pcVar2;
        if (pcVar3 != (cmConnection *)0x0) {
          (*pcVar3->_vptr_cmConnection[2])();
        }
        __first._M_current = __first._M_current + 1;
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar1);
    puVar4 = (this->Connections).
             super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->Connections).
                  super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
  }
LAB_00458f22:
  __flags = (int)uVar7;
  std::
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ::_M_erase(&this->Connections,__first,
             (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
             ((long)&(puVar4->_M_t).
                     super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
                     super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
                     super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl + uVar5));
  __fd = (int)__first._M_current;
  uv_rwlock_wrunlock(&this->ConnectionsMutex);
  if ((this->Connections).
      super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->Connections).
      super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    auto_async_t::send(&this->ShutdownSignal,__fd,__buf,(size_t)__n,__flags);
    return;
  }
  return;
}

Assistant:

void cmServerBase::OnDisconnect(cmConnection* pConnection)
{
  auto pred = [pConnection](const std::unique_ptr<cmConnection>& m) {
    return m.get() == pConnection;
  };
  uv_rwlock_wrlock(&ConnectionsMutex);
  Connections.erase(
    std::remove_if(Connections.begin(), Connections.end(), pred),
    Connections.end());
  uv_rwlock_wrunlock(&ConnectionsMutex);
  if (Connections.empty()) {
    this->ShutdownSignal.send();
  }
}